

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_help.cpp
# Opt level: O0

void __thiscall Help_HasSwitches_Test::~Help_HasSwitches_Test(Help_HasSwitches_Test *this)

{
  Help_HasSwitches_Test *this_local;
  
  ~Help_HasSwitches_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (Help, HasSwitches) {
    {
        opt<std::string> option1{"arg1", positional};
        alias option2 ("alias1", aliasopt{option1});
        option::options_container container{&option1, &option2};
        EXPECT_FALSE (details::has_switches (nullptr, container));
    }
    {
        opt<std::string> option3{"arg2"};
        option::options_container container{&option3};
        EXPECT_TRUE (details::has_switches (nullptr, container));
    }
}